

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::EstimateFee(JsonMappingApi *this,string *request_message)

{
  function<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
  local_58;
  function<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<void(cfd::js::api::json::EstimateFeeRequest*,cfd::js::api::json::EstimateFeeResponse*)>::
  function<void(&)(cfd::js::api::json::EstimateFeeRequest*,cfd::js::api::json::EstimateFeeResponse*),void>
            ((function<void(cfd::js::api::json::EstimateFeeRequest*,cfd::js::api::json::EstimateFeeResponse*)>
              *)&local_38,TransactionJsonApi::EstimateFee);
  std::
  function<void(cfd::js::api::json::EstimateFeeRequest*,cfd::js::api::json::EstimateFeeResponse*)>::
  function<void(&)(cfd::js::api::json::EstimateFeeRequest*,cfd::js::api::json::EstimateFeeResponse*),void>
            ((function<void(cfd::js::api::json::EstimateFeeRequest*,cfd::js::api::json::EstimateFeeResponse*)>
              *)&local_58,ElementsTransactionJsonApi::EstimateFee);
  ExecuteElementsCheckDirectApi<cfd::js::api::json::EstimateFeeRequest,cfd::js::api::json::EstimateFeeResponse>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
  ::~function(&local_58);
  std::
  function<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::EstimateFee(const std::string &request_message) {
  return ExecuteElementsCheckDirectApi<
      api::json::EstimateFeeRequest, api::json::EstimateFeeResponse>(
      request_message, TransactionJsonApi::EstimateFee,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionJsonApi::EstimateFee);
#else
      TransactionJsonApi::EstimateFee);
#endif
}